

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_delete_all_keys(char **retstr)

{
  uint uVar1;
  PageantClientOp *pPVar2;
  char *pcVar3;
  uint reply;
  PageantClientOp *pco;
  char **retstr_local;
  
  pPVar2 = pageant_client_op_new();
  BinarySink_put_byte(pPVar2->binarysink_,'\x13');
  uVar1 = pageant_client_op_query(pPVar2);
  pageant_client_op_free(pPVar2);
  if (uVar1 == 6) {
    pPVar2 = pageant_client_op_new();
    BinarySink_put_byte(pPVar2->binarysink_,'\t');
    uVar1 = pageant_client_op_query(pPVar2);
    pageant_client_op_free(pPVar2);
    if (uVar1 == 6) {
      *retstr = (char *)0x0;
      retstr_local._4_4_ = 0;
    }
    else {
      pcVar3 = dupstr("Agent failed to delete SSH-1 keys");
      *retstr = pcVar3;
      retstr_local._4_4_ = 1;
    }
  }
  else {
    pcVar3 = dupstr("Agent failed to delete SSH-2 keys");
    *retstr = pcVar3;
    retstr_local._4_4_ = 1;
  }
  return retstr_local._4_4_;
}

Assistant:

int pageant_delete_all_keys(char **retstr)
{
    PageantClientOp *pco;
    unsigned reply;

    pco = pageant_client_op_new();
    put_byte(pco, SSH2_AGENTC_REMOVE_ALL_IDENTITIES);
    reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete SSH-2 keys");
        return PAGEANT_ACTION_FAILURE;
    }

    pco = pageant_client_op_new();
    put_byte(pco, SSH1_AGENTC_REMOVE_ALL_RSA_IDENTITIES);
    reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete SSH-1 keys");
        return PAGEANT_ACTION_FAILURE;
    }

    *retstr = NULL;
    return PAGEANT_ACTION_OK;
}